

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

XMLUri * __thiscall xercesc_4_0::XMLUri::operator=(XMLUri *this,XMLUri *toAssign)

{
  CleanupType_conflict5 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLUri> local_28;
  
  cleanUp(this);
  local_28.fToCall = (MFPT)cleanUp;
  local_28._16_8_ = 0;
  local_28.fObject = this;
  initialize(this,toAssign);
  local_28.fObject = (XMLUri *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLUri>::~JanitorMemFunCall(&local_28);
  return this;
}

Assistant:

XMLUri& XMLUri::operator=(const XMLUri& toAssign)
{
    cleanUp();

    CleanupType cleanup(this, &XMLUri::cleanUp);

    try {
        initialize(toAssign);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();

    return *this;
}